

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum dstFuncRGB_;
  Context *pCVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  BlendCase *pBVar6;
  char *pcVar7;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  EnumGL *pEVar8;
  EnumGL *pEVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  ulong extraout_RAX;
  ulong uVar13;
  bool bVar14;
  char *local_788;
  TestCaseGroup *local_780;
  Vector<float,_4> local_6f0;
  BlendParams local_6e0;
  undefined1 local_6b8 [8];
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  paramSets_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  undefined1 local_618 [8];
  string description_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined1 local_590 [8];
  string name_2;
  EnumGL *eqAlpha;
  EnumGL *eqRGB;
  int equationAlphaNdx;
  int equationRGBNdx;
  TestCaseGroup *group_1;
  int i;
  BlendParams local_538;
  Vector<float,_4> local_510;
  BlendParams local_500;
  Vector<float,_4> local_4d8;
  BlendParams local_4c8;
  Vector<float,_4> local_4a0;
  BlendParams local_490;
  undefined1 local_468 [8];
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  paramSets_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string description_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  string name_1;
  char *dstOrSrcStr;
  EnumGL *funcAlpha;
  EnumGL *funcRGB;
  TestCaseGroup *curGroup;
  int iStack_278;
  bool isSrc;
  int alphaFuncNdx;
  int rgbFuncNdx;
  int isDstI;
  TestCaseGroup *dstGroup;
  TestCaseGroup *srcGroup;
  TestCaseGroup *mainGroup;
  BlendParams local_248;
  undefined1 local_220 [8];
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  paramSets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string name;
  EnumGL *dst;
  EnumGL *src;
  EnumGL *eq;
  int dstFuncNdx;
  int srcFuncNdx;
  int equationNdx;
  TestCaseGroup *group;
  Vec4 defaultBlendColor;
  BlendTests *this_local;
  
  defaultBlendColor.m_data._8_8_ = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&group,0.2,0.4,0.6,0.8);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"equation_src_func_dst_func",
             "Combinations of Blend Equations and Functions");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (dstFuncNdx = 0; dstFuncNdx < 3; dstFuncNdx = dstFuncNdx + 1) {
    for (eq._4_4_ = 0; eq._4_4_ < 0xf; eq._4_4_ = eq._4_4_ + 1) {
      for (eq._0_4_ = 0; (int)eq < 0xf; eq._0_4_ = (int)eq + 1) {
        name.field_2._8_8_ = init::blendFunctions + (int)eq;
        if (((EnumGL *)name.field_2._8_8_)->glValue != 0x308) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"",
                     (allocator<char> *)(description.field_2._M_local_buf + 0xf));
          std::operator+(&local_f8,&local_118,init::blendEquations[dstFuncNdx].nameStr);
          std::operator+(&local_d8,&local_f8,"_");
          std::operator+(&local_b8,&local_d8,init::blendFunctions[eq._4_4_].nameStr);
          std::operator+(&local_98,&local_b8,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,&local_98,*(char **)(name.field_2._8_8_ + 8));
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(description.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"",
                     (allocator<char> *)
                     ((long)&paramSets.
                             super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::operator+(&local_1e0,&local_200,"Equations ");
          pcVar5 = glu::getBlendEquationName(init::blendEquations[dstFuncNdx].glValue);
          std::operator+(&local_1c0,&local_1e0,pcVar5);
          std::operator+(&local_1a0,&local_1c0,", src funcs ");
          pcVar5 = glu::getBlendFactorName(init::blendFunctions[eq._4_4_].glValue);
          std::operator+(&local_180,&local_1a0,pcVar5);
          std::operator+(&local_160,&local_180,", dst funcs ");
          pcVar5 = glu::getBlendFactorName(*(int *)name.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_160,pcVar5);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&paramSets.
                             super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                    *)local_220);
          GVar1 = init::blendEquations[dstFuncNdx].glValue;
          GVar2 = init::blendFunctions[eq._4_4_].glValue;
          dstFuncRGB_ = *(GLenum *)name.field_2._8_8_;
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&mainGroup,(Vector<float,_4> *)&group);
          BlendParams::BlendParams
                    (&local_248,GVar1,GVar2,dstFuncRGB_,GVar1,GVar2,dstFuncRGB_,(Vec4 *)&mainGroup);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)local_220,&local_248);
          pBVar6 = (BlendCase *)operator_new(0x338);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlendCase::BlendCase
                    (pBVar6,pCVar3,pcVar5,pcVar7,
                     (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_220);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pBVar6);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::~vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                     *)local_220);
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)local_78);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"rgb_func_alpha_func",
             "Combinations of RGB and Alpha Functions");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"src","Source functions");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"dst","Destination functions");
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_01);
  for (alphaFuncNdx = 0; alphaFuncNdx < 2; alphaFuncNdx = alphaFuncNdx + 1) {
    for (iStack_278 = 0; iStack_278 < 0xf; iStack_278 = iStack_278 + 1) {
      for (curGroup._4_4_ = 0; curGroup._4_4_ < 0xf; curGroup._4_4_ = curGroup._4_4_ + 1) {
        bVar14 = alphaFuncNdx == 0;
        local_780 = this_01;
        if (bVar14) {
          local_780 = this_00;
        }
        pEVar8 = init::blendFunctions + iStack_278;
        pEVar9 = init::blendFunctions + curGroup._4_4_;
        if (bVar14) {
          local_788 = " src";
        }
        else {
          local_788 = " dst";
        }
        local_788 = local_788 + 1;
        name_1.field_2._8_8_ = local_788;
        if ((bVar14) || ((pEVar8->glValue != 0x308 && (pEVar9->glValue != 0x308)))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"",
                     (allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
          std::operator+(&local_300,&local_320,init::blendFunctions[iStack_278].nameStr);
          std::operator+(&local_2e0,&local_300,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c0,&local_2e0,init::blendFunctions[curGroup._4_4_].nameStr);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_448,"",
                     (allocator<char> *)
                     ((long)&paramSets_1.
                             super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::operator+(&local_428,&local_448,"RGB ");
          std::operator+(&local_408,&local_428,(char *)name_1.field_2._8_8_);
          std::operator+(&local_3e8,&local_408," func ");
          pcVar5 = glu::getBlendFactorName(pEVar8->glValue);
          std::operator+(&local_3c8,&local_3e8,pcVar5);
          std::operator+(&local_3a8,&local_3c8,", alpha ");
          std::operator+(&local_388,&local_3a8,(char *)name_1.field_2._8_8_);
          std::operator+(&local_368,&local_388," func ");
          pcVar5 = glu::getBlendFactorName(pEVar9->glValue);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_348,&local_368,pcVar5);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&paramSets_1.
                             super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                    *)local_468);
          GVar1 = pEVar8->glValue;
          GVar2 = pEVar9->glValue;
          tcu::Vector<float,_4>::Vector(&local_4a0,(Vector<float,_4> *)&group);
          BlendParams::BlendParams(&local_490,0x8006,GVar1,1,0x8006,GVar2,1,&local_4a0);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)local_468,&local_490);
          GVar1 = pEVar8->glValue;
          GVar2 = pEVar9->glValue;
          tcu::Vector<float,_4>::Vector(&local_4d8,(Vector<float,_4> *)&group);
          BlendParams::BlendParams(&local_4c8,0x8006,GVar1,0,0x8006,GVar2,0,&local_4d8);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)local_468,&local_4c8);
          GVar1 = pEVar8->glValue;
          GVar2 = pEVar9->glValue;
          tcu::Vector<float,_4>::Vector(&local_510,(Vector<float,_4> *)&group);
          BlendParams::BlendParams(&local_500,0x8006,GVar1,0x300,0x8006,GVar2,0x300,&local_510);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)local_468,&local_500);
          GVar1 = pEVar8->glValue;
          GVar2 = pEVar9->glValue;
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&stack0xfffffffffffffab8,(Vector<float,_4> *)&group);
          BlendParams::BlendParams
                    (&local_538,0x8006,GVar1,0x306,0x8006,GVar2,0x306,
                     (Vec4 *)&stack0xfffffffffffffab8);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)local_468,&local_538);
          if (!bVar14) {
            for (group_1._4_4_ = 0;
                sVar10 = std::
                         vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                         ::size((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                 *)local_468), group_1._4_4_ < (int)sVar10;
                group_1._4_4_ = group_1._4_4_ + 1) {
              pvVar11 = std::
                        vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                        ::operator[]((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                      *)local_468,(long)group_1._4_4_);
              pvVar12 = std::
                        vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                        ::operator[]((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                      *)local_468,(long)group_1._4_4_);
              std::swap<unsigned_int>(&pvVar11->srcFuncRGB,&pvVar12->dstFuncRGB);
              pvVar11 = std::
                        vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                        ::operator[]((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                      *)local_468,(long)group_1._4_4_);
              pvVar12 = std::
                        vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                        ::operator[]((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                      *)local_468,(long)group_1._4_4_);
              std::swap<unsigned_int>(&pvVar11->srcFuncAlpha,&pvVar12->dstFuncAlpha);
            }
          }
          pBVar6 = (BlendCase *)operator_new(0x338);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          BlendCase::BlendCase
                    (pBVar6,pCVar3,pcVar5,pcVar7,
                     (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_468);
          tcu::TestNode::addChild((TestNode *)local_780,(TestNode *)pBVar6);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::~vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                     *)local_468);
          std::__cxx11::string::~string((string *)local_348);
          std::__cxx11::string::~string((string *)local_2c0);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"rgb_equation_alpha_equation",
             "Combinations of RGB and Alpha Equation Combinations");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  eqRGB._4_4_ = 0;
  uVar13 = extraout_RAX;
  while ((int)eqRGB._4_4_ < 3) {
    for (eqRGB._0_4_ = 0; (int)eqRGB < 3; eqRGB._0_4_ = (int)eqRGB + 1) {
      name_2.field_2._8_8_ = init::blendEquations + (int)eqRGB;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"",
                 (allocator<char> *)(description_2.field_2._M_local_buf + 0xf));
      std::operator+(&local_5d0,&local_5f0,init::blendEquations[(int)eqRGB._4_4_].nameStr);
      std::operator+(&local_5b0,&local_5d0,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590,
                     &local_5b0,*(char **)(name_2.field_2._8_8_ + 8));
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(description_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_698,"",
                 (allocator<char> *)
                 ((long)&paramSets_2.
                         super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_678,&local_698,"RGB equation ");
      pcVar5 = glu::getBlendEquationName(init::blendEquations[(int)eqRGB._4_4_].glValue);
      std::operator+(&local_658,&local_678,pcVar5);
      std::operator+(&local_638,&local_658,", alpha equation ");
      pcVar5 = glu::getBlendEquationName(*(int *)name_2.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,
                     &local_638,pcVar5);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&paramSets_2.
                         super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                *)local_6b8);
      GVar1 = init::blendEquations[(int)eqRGB._4_4_].glValue;
      GVar2 = *(GLenum *)name_2.field_2._8_8_;
      tcu::Vector<float,_4>::Vector(&local_6f0,(Vector<float,_4> *)&group);
      BlendParams::BlendParams(&local_6e0,GVar1,1,1,GVar2,1,1,&local_6f0);
      std::
      vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::push_back((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                   *)local_6b8,&local_6e0);
      pBVar6 = (BlendCase *)operator_new(0x338);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      BlendCase::BlendCase
                (pBVar6,pCVar3,pcVar5,pcVar7,
                 (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                  *)local_6b8);
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pBVar6);
      std::
      vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::~vector((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                 *)local_6b8);
      std::__cxx11::string::~string((string *)local_618);
      std::__cxx11::string::~string((string *)local_590);
    }
    eqRGB._4_4_ = eqRGB._4_4_ + 1;
    uVar13 = (ulong)eqRGB._4_4_;
  }
  return (int)uVar13;
}

Assistant:

void BlendTests::init (void)
{
	struct EnumGL
	{
		GLenum			glValue;
		const char*		nameStr;
	};

	static const EnumGL blendEquations[] =
	{
		{ GL_FUNC_ADD,					"add"					},
		{ GL_FUNC_SUBTRACT,				"subtract"				},
		{ GL_FUNC_REVERSE_SUBTRACT,		"reverse_subtract"		}
	};

	static const EnumGL blendFunctions[] =
	{
		{ GL_ZERO,							"zero"						},
		{ GL_ONE,							"one"						},
		{ GL_SRC_COLOR,						"src_color"					},
		{ GL_ONE_MINUS_SRC_COLOR,			"one_minus_src_color"		},
		{ GL_DST_COLOR,						"dst_color"					},
		{ GL_ONE_MINUS_DST_COLOR,			"one_minus_dst_color"		},
		{ GL_SRC_ALPHA,						"src_alpha"					},
		{ GL_ONE_MINUS_SRC_ALPHA,			"one_minus_src_alpha"		},
		{ GL_DST_ALPHA,						"dst_alpha"					},
		{ GL_ONE_MINUS_DST_ALPHA,			"one_minus_dst_alpha"		},
		{ GL_CONSTANT_COLOR,				"constant_color"			},
		{ GL_ONE_MINUS_CONSTANT_COLOR,		"one_minus_constant_color"	},
		{ GL_CONSTANT_ALPHA,				"constant_alpha"			},
		{ GL_ONE_MINUS_CONSTANT_ALPHA,		"one_minus_constant_alpha"	},
		{ GL_SRC_ALPHA_SATURATE,			"src_alpha_saturate"		}
	};

	const Vec4 defaultBlendColor(0.2f, 0.4f, 0.6f, 0.8f);

	// Test all blend equation, src blend function, dst blend function combinations. RGB and alpha modes are the same.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "equation_src_func_dst_func", "Combinations of Blend Equations and Functions");
		addChild(group);

		for (int equationNdx = 0;	equationNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationNdx++)
		for (int srcFuncNdx = 0;	srcFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	srcFuncNdx++)
		for (int dstFuncNdx = 0;	dstFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	dstFuncNdx++)
		{
			const EnumGL& eq	= blendEquations[equationNdx];
			const EnumGL& src	= blendFunctions[srcFuncNdx];
			const EnumGL& dst	= blendFunctions[dstFuncNdx];

			if (dst.glValue == GL_SRC_ALPHA_SATURATE) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + eq.nameStr + "_" + src.nameStr + "_" + dst.nameStr;
			string description	= string("") +
								  "Equations "		+ getBlendEquationName(eq.glValue) +
								  ", src funcs "	+ getBlendFactorName(src.glValue) +
								  ", dst funcs "	+ getBlendFactorName(dst.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eq.glValue, src.glValue, dst.glValue, eq.glValue, src.glValue, dst.glValue, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB src, alpha src and RGB dst, alpha dst combinations. Equations are ADD.
	// \note For all RGB src, alpha src combinations, also test a couple of different RGBA dst functions, and vice versa.

	{
		TestCaseGroup* mainGroup = new TestCaseGroup(m_context, "rgb_func_alpha_func", "Combinations of RGB and Alpha Functions");
		addChild(mainGroup);
		TestCaseGroup* srcGroup = new TestCaseGroup(m_context, "src", "Source functions");
		TestCaseGroup* dstGroup = new TestCaseGroup(m_context, "dst", "Destination functions");
		mainGroup->addChild(srcGroup);
		mainGroup->addChild(dstGroup);

		for (int isDstI = 0;		isDstI <= 1;										isDstI++)
		for (int rgbFuncNdx = 0;	rgbFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	rgbFuncNdx++)
		for (int alphaFuncNdx = 0;	alphaFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	alphaFuncNdx++)
		{
			bool			isSrc			= isDstI == 0;
			TestCaseGroup*	curGroup		= isSrc ? srcGroup : dstGroup;
			const EnumGL&	funcRGB			= blendFunctions[rgbFuncNdx];
			const EnumGL&	funcAlpha		= blendFunctions[alphaFuncNdx];
			const char*		dstOrSrcStr		= isSrc ? "src" : "dst";

			if (!isSrc && (funcRGB.glValue == GL_SRC_ALPHA_SATURATE || funcAlpha.glValue == GL_SRC_ALPHA_SATURATE)) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + funcRGB.nameStr + "_" + funcAlpha.nameStr;
			string description	= string("") +
								  "RGB "		+ dstOrSrcStr + " func " + getBlendFactorName(funcRGB.glValue) +
								  ", alpha "	+ dstOrSrcStr + " func " + getBlendFactorName(funcAlpha.glValue);

			// First, make param sets as if this was a src case.

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ONE,			GL_FUNC_ADD, funcAlpha.glValue, GL_ONE,			defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ZERO,			GL_FUNC_ADD, funcAlpha.glValue, GL_ZERO,		defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_SRC_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_SRC_COLOR,	defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_DST_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_DST_COLOR,	defaultBlendColor));

			// Swap src and dst params if this is a dst case.

			if (!isSrc)
			{
				for (int i = 0; i < (int)paramSets.size(); i++)
				{
					std::swap(paramSets[i].srcFuncRGB,		paramSets[i].dstFuncRGB);
					std::swap(paramSets[i].srcFuncAlpha,	paramSets[i].dstFuncAlpha);
				}
			}

			curGroup->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB and alpha equation combinations. Src and dst funcs are ONE for both.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "rgb_equation_alpha_equation", "Combinations of RGB and Alpha Equation Combinations");
		addChild(group);

		for (int equationRGBNdx = 0;	equationRGBNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationRGBNdx++)
		for (int equationAlphaNdx = 0;	equationAlphaNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationAlphaNdx++)
		{
			const EnumGL& eqRGB			= blendEquations[equationRGBNdx];
			const EnumGL& eqAlpha		= blendEquations[equationAlphaNdx];

			string name			= string("") + eqRGB.nameStr + "_" + eqAlpha.nameStr;
			string description	= string("") +
								  "RGB equation "		+ getBlendEquationName(eqRGB.glValue) +
								  ", alpha equation "	+ getBlendEquationName(eqAlpha.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eqRGB.glValue, GL_ONE, GL_ONE, eqAlpha.glValue, GL_ONE, GL_ONE, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}
}